

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<false,float,duckdb::NotDistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  const_reference pvVar2;
  idx_t iVar3;
  uint uVar4;
  idx_t iVar5;
  idx_t iVar6;
  idx_t iVar7;
  bool bVar8;
  uchar **rhs_locations;
  SelectionVector *lhs_sel;
  float local_68;
  float local_64;
  data_ptr_t local_60;
  idx_t local_58;
  value_type local_50;
  ulong local_48;
  data_ptr_t local_40;
  SelectionVector *local_38;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  local_38 = (lhs_format->unified).sel;
  local_60 = (lhs_format->unified).data;
  local_40 = rhs_row_locations->data;
  pvVar2 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  local_48 = col_idx >> 3;
  local_50 = *pvVar2;
  local_58 = count;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar7 = 0;
      iVar6 = 0;
      do {
        iVar5 = iVar6;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar5 = (idx_t)sel->sel_vector[iVar6];
        }
        iVar3 = iVar5;
        if (local_38->sel_vector != (sel_t *)0x0) {
          iVar3 = (idx_t)local_38->sel_vector[iVar5];
        }
        local_68 = *(float *)(*(long *)(local_40 + iVar5 * 8) + local_50);
        bVar8 = (1 << ((byte)col_idx & 7) &
                (uint)*(byte *)(*(long *)(local_40 + iVar5 * 8) + local_48)) != 0;
        if (bVar8) {
          bVar8 = Equals::Operation<float>((float *)(local_60 + iVar3 * 4),&local_68);
          count = local_58;
        }
        if (bVar8 != false) {
          sel->sel_vector[iVar7] = (sel_t)iVar5;
          iVar7 = iVar7 + 1;
        }
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
      return iVar7;
    }
  }
  else if (count != 0) {
    iVar7 = 0;
    iVar6 = 0;
    do {
      iVar5 = iVar6;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar5 = (idx_t)sel->sel_vector[iVar6];
      }
      iVar3 = iVar5;
      if (local_38->sel_vector != (sel_t *)0x0) {
        iVar3 = (idx_t)local_38->sel_vector[iVar5];
      }
      puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        bVar8 = false;
      }
      else {
        bVar8 = (puVar1[iVar3 >> 6] >> (iVar3 & 0x3f) & 1) == 0;
      }
      uVar4 = (uint)*(byte *)(*(long *)(local_40 + iVar5 * 8) + local_48) & 1 << ((byte)col_idx & 7)
      ;
      local_64 = *(float *)(*(long *)(local_40 + iVar5 * 8) + local_50);
      if ((bVar8 == false) && (uVar4 != 0)) {
        bVar8 = Equals::Operation<float>((float *)(local_60 + iVar3 * 4),&local_64);
        count = local_58;
      }
      else {
        bVar8 = (bool)(bVar8 ^ uVar4 == 0 ^ 1);
      }
      if (bVar8 != false) {
        sel->sel_vector[iVar7] = (sel_t)iVar5;
        iVar7 = iVar7 + 1;
      }
      iVar6 = iVar6 + 1;
    } while (count != iVar6);
    return iVar7;
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}